

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_ecf33::SwiftCompilerShellCommand::executeExternalCommand
          (SwiftCompilerShellCommand *this,BuildSystem *system,TaskInterface ti,
          QueueJobContext *context,
          Optional<std::function<void_(llbuild::basic::ProcessResult)>_> *completionFn)

{
  ProcessResult __args;
  ProcessResult __args_00;
  ProcessResult __args_01;
  ProcessResult __args_02;
  ProcessResult __args_03;
  ProcessResult __args_04;
  ProcessResult __args_05;
  TaskInterface ti_00;
  Optional<std::function<void_(llbuild::basic::ProcessResult)>_> *context_00;
  bool bVar1;
  ulong uVar2;
  size_type sVar3;
  size_type sVar4;
  BuildSystemDelegate *pBVar5;
  function<void_(llbuild::basic::ProcessResult)> *pfVar6;
  FileSystem *pFVar7;
  anon_class_96_5_980d2744 local_428;
  work_fn_ty local_3c8;
  QueueJob local_3a8;
  ProcessResult local_380;
  ArrayRef<llvm::StringRef> local_358;
  ProcessStatus local_348;
  undefined4 local_344;
  ProcessStatus result;
  int iStack_33c;
  llbuild_pid_t lStack_338;
  undefined4 uStack_334;
  uint64_t local_330;
  uint64_t uStack_328;
  uint64_t local_320;
  StringRef local_318;
  SwiftCompilerShellCommand *local_308;
  void *local_300;
  undefined1 local_2f8 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  depsFiles;
  undefined1 local_2d0 [8];
  vector<llvm::StringRef,_std::allocator<llvm::StringRef>_> commandLine;
  SmallString<64U> outputFileMapPath;
  undefined8 uStack_260;
  undefined8 local_258;
  undefined8 uStack_250;
  uint64_t local_248;
  Twine local_240;
  undefined8 local_228;
  undefined4 local_220;
  char *local_218;
  size_t local_210;
  ProcessResult local_208;
  Twine local_1e0;
  undefined8 local_1c8;
  undefined4 local_1c0;
  char *local_1b8;
  size_t local_1b0;
  ProcessResult local_1a8;
  Twine local_180;
  undefined8 local_168;
  undefined4 local_160;
  char *local_158;
  size_t local_150;
  ProcessResult local_148;
  Twine local_120;
  undefined8 local_108;
  undefined4 local_100;
  char *local_f8;
  size_t local_f0;
  ProcessResult local_e8;
  Twine local_c0;
  undefined8 local_a8;
  undefined4 local_a0;
  char *local_98;
  size_t local_90;
  Optional<std::function<void_(llbuild::basic::ProcessResult)>_> *local_88;
  Optional<std::function<void_(llbuild::basic::ProcessResult)>_> *completionFn_local;
  QueueJobContext *context_local;
  BuildSystem *system_local;
  SwiftCompilerShellCommand *this_local;
  TaskInterface ti_local;
  
  ti_local.impl = ti.ctx;
  this_local = (SwiftCompilerShellCommand *)ti.impl;
  local_88 = completionFn;
  completionFn_local = (Optional<std::function<void_(llbuild::basic::ProcessResult)>_> *)context;
  context_local = (QueueJobContext *)system;
  system_local = (BuildSystem *)this;
  bVar1 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty(&this->sourcesList);
  if (bVar1) {
    pBVar5 = llbuild::buildsystem::BuildSystem::getDelegate((BuildSystem *)context_local);
    ti_local.ctx = "";
    local_98 = "";
    local_90 = strlen("");
    local_a8 = 0;
    local_a0 = 0;
    llvm::Twine::Twine(&local_c0,"no configured \'sources\'");
    (*pBVar5->_vptr_BuildSystemDelegate[3])(pBVar5,local_98,local_90,&local_a8,&local_c0);
    bVar1 = llvm::Optional<std::function<void_(llbuild::basic::ProcessResult)>_>::hasValue
                      (completionFn);
    if (bVar1) {
      pfVar6 = llvm::Optional<std::function<void_(llbuild::basic::ProcessResult)>_>::getValue
                         (completionFn);
      llbuild::basic::ProcessResult::ProcessResult(&local_e8,Failed,-1,-1,0,0,0);
      __args.pid = local_e8.pid;
      __args._12_4_ = local_e8._12_4_;
      __args.status = local_e8.status;
      __args.exitCode = local_e8.exitCode;
      __args.utime = local_e8.utime;
      __args.stime = local_e8.stime;
      __args.maxrss = local_e8.maxrss;
      std::function<void_(llbuild::basic::ProcessResult)>::operator()(pfVar6,__args);
    }
  }
  else {
    bVar1 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::empty(&this->objectsList);
    if (bVar1) {
      pBVar5 = llbuild::buildsystem::BuildSystem::getDelegate((BuildSystem *)context_local);
      local_f8 = "";
      local_f0 = strlen("");
      local_108 = 0;
      local_100 = 0;
      llvm::Twine::Twine(&local_120,"no configured \'objects\'");
      (*pBVar5->_vptr_BuildSystemDelegate[3])(pBVar5,local_f8,local_f0,&local_108,&local_120);
      bVar1 = llvm::Optional<std::function<void_(llbuild::basic::ProcessResult)>_>::hasValue
                        (completionFn);
      if (bVar1) {
        pfVar6 = llvm::Optional<std::function<void_(llbuild::basic::ProcessResult)>_>::getValue
                           (completionFn);
        llbuild::basic::ProcessResult::ProcessResult(&local_148,Failed,-1,-1,0,0,0);
        __args_00.pid = local_148.pid;
        __args_00._12_4_ = local_148._12_4_;
        __args_00.status = local_148.status;
        __args_00.exitCode = local_148.exitCode;
        __args_00.utime = local_148.utime;
        __args_00.stime = local_148.stime;
        __args_00.maxrss = local_148.maxrss;
        std::function<void_(llbuild::basic::ProcessResult)>::operator()(pfVar6,__args_00);
      }
    }
    else {
      uVar2 = std::__cxx11::string::empty();
      if ((uVar2 & 1) == 0) {
        uVar2 = std::__cxx11::string::empty();
        if ((uVar2 & 1) == 0) {
          sVar3 = std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::size(&this->sourcesList);
          sVar4 = std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::size(&this->objectsList);
          if (sVar3 == sVar4) {
            pFVar7 = llbuild::buildsystem::BuildSystem::getFileSystem((BuildSystem *)context_local);
            (*pFVar7->_vptr_FileSystem[3])(pFVar7,&this->tempsPath);
            llvm::SmallString<64U>::SmallString
                      ((SmallString<64U> *)
                       &commandLine.
                        super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage);
            getOutputFileMapPath
                      (this,(SmallVectorImpl<char> *)
                            &commandLine.
                             super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage);
            std::vector<llvm::StringRef,_std::allocator<llvm::StringRef>_>::vector
                      ((vector<llvm::StringRef,_std::allocator<llvm::StringRef>_> *)local_2d0);
            join_0x00000010_0x00000000_ =
                 llvm::SmallString::operator_cast_to_StringRef
                           ((SmallString *)
                            &commandLine.
                             super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage);
            constructCommandLineArgs
                      (this,join_0x00000010_0x00000000_,
                       (vector<llvm::StringRef,_std::allocator<llvm::StringRef>_> *)local_2d0);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_2f8);
            local_308 = this_local;
            local_300 = ti_local.impl;
            local_318 = llvm::SmallString::operator_cast_to_StringRef
                                  ((SmallString *)
                                   &commandLine.
                                    super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
            ti_00.ctx = local_300;
            ti_00.impl = local_308;
            bVar1 = writeOutputFileMap(this,ti_00,local_318,
                                       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        *)local_2f8);
            context_00 = completionFn_local;
            if (((bVar1 ^ 0xffU) & 1) == 0) {
              llvm::ArrayRef<llvm::StringRef>::ArrayRef<std::allocator<llvm::StringRef>>
                        (&local_358,
                         (vector<llvm::StringRef,_std::allocator<llvm::StringRef>_> *)local_2d0);
              local_348 = llbuild::core::TaskInterface::spawn
                                    ((TaskInterface *)&this_local,(QueueJobContext *)context_00,
                                     local_358);
              if (local_348 == Succeeded) {
                local_428.ti.impl = this_local;
                local_428.ti.ctx = ti_local.impl;
                local_428.this = this;
                llvm::Optional<std::function<void_(llbuild::basic::ProcessResult)>_>::Optional
                          (&local_428.completionFn,completionFn);
                local_428.result = local_348;
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::vector(&local_428.depsFiles,
                         (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)local_2f8);
                std::function<void(llbuild::basic::QueueJobContext*)>::
                function<(anonymous_namespace)::SwiftCompilerShellCommand::executeExternalCommand(llbuild::buildsystem::BuildSystem&,llbuild::core::TaskInterface,llbuild::basic::QueueJobContext*,llvm::Optional<std::function<void(llbuild::basic::ProcessResult)>>)::_lambda(llbuild::basic::QueueJobContext*)_1_,void>
                          ((function<void(llbuild::basic::QueueJobContext*)> *)&local_3c8,&local_428
                          );
                llbuild::basic::QueueJob::QueueJob(&local_3a8,(JobDescriptor *)this,&local_3c8);
                llbuild::core::TaskInterface::spawn((TaskInterface *)&this_local,&local_3a8,High);
                llbuild::basic::QueueJob::~QueueJob(&local_3a8);
                std::function<void_(llbuild::basic::QueueJobContext_*)>::~function(&local_3c8);
                (anonymous_namespace)::SwiftCompilerShellCommand::
                executeExternalCommand(llbuild::buildsystem::BuildSystem&,llbuild::core::TaskInterface,llbuild::basic::QueueJobContext*,llvm::Optional<std::function<void(llbuild::basic::ProcessResult)>>)
                ::{lambda(llbuild::basic::QueueJobContext*)#1}::~Optional
                          ((_lambda_llbuild__basic__QueueJobContext___1_ *)&local_428);
                local_344 = 0;
              }
              else {
                bVar1 = llvm::Optional<std::function<void_(llbuild::basic::ProcessResult)>_>::
                        hasValue(completionFn);
                if (bVar1) {
                  pfVar6 = llvm::Optional<std::function<void_(llbuild::basic::ProcessResult)>_>::
                           getValue(completionFn);
                  llbuild::basic::ProcessResult::ProcessResult(&local_380,local_348,-1,-1,0,0,0);
                  __args_05.pid = local_380.pid;
                  __args_05._12_4_ = local_380._12_4_;
                  __args_05.status = local_380.status;
                  __args_05.exitCode = local_380.exitCode;
                  __args_05.utime = local_380.utime;
                  __args_05.stime = local_380.stime;
                  __args_05.maxrss = local_380.maxrss;
                  std::function<void_(llbuild::basic::ProcessResult)>::operator()(pfVar6,__args_05);
                }
                local_344 = 1;
              }
            }
            else {
              bVar1 = llvm::Optional<std::function<void_(llbuild::basic::ProcessResult)>_>::hasValue
                                (completionFn);
              if (bVar1) {
                pfVar6 = llvm::Optional<std::function<void_(llbuild::basic::ProcessResult)>_>::
                         getValue(completionFn);
                llbuild::basic::ProcessResult::ProcessResult
                          ((ProcessResult *)&result,Failed,-1,-1,0,0,0);
                __args_04.pid = lStack_338;
                __args_04._12_4_ = uStack_334;
                __args_04.status = result;
                __args_04.exitCode = iStack_33c;
                __args_04.utime = local_330;
                __args_04.stime = uStack_328;
                __args_04.maxrss = local_320;
                std::function<void_(llbuild::basic::ProcessResult)>::operator()(pfVar6,__args_04);
              }
              local_344 = 1;
            }
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_2f8);
            std::vector<llvm::StringRef,_std::allocator<llvm::StringRef>_>::~vector
                      ((vector<llvm::StringRef,_std::allocator<llvm::StringRef>_> *)local_2d0);
            llvm::SmallString<64U>::~SmallString
                      ((SmallString<64U> *)
                       &commandLine.
                        super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage);
          }
          else {
            pBVar5 = llbuild::buildsystem::BuildSystem::getDelegate((BuildSystem *)context_local);
            local_218 = "";
            local_210 = strlen("");
            local_228 = 0;
            local_220 = 0;
            llvm::Twine::Twine(&local_240,"\'sources\' and \'objects\' are not the same size");
            (*pBVar5->_vptr_BuildSystemDelegate[3])
                      (pBVar5,local_218,local_210,&local_228,&local_240);
            bVar1 = llvm::Optional<std::function<void_(llbuild::basic::ProcessResult)>_>::hasValue
                              (completionFn);
            if (bVar1) {
              pfVar6 = llvm::Optional<std::function<void_(llbuild::basic::ProcessResult)>_>::
                       getValue(completionFn);
              llbuild::basic::ProcessResult::ProcessResult
                        ((ProcessResult *)
                         (outputFileMapPath.super_SmallVector<char,_64U>.
                          super_SmallVectorStorage<char,_64U>.InlineElts + 0x38),Failed,-1,-1,0,0,0)
              ;
              __args_03._8_8_ = uStack_260;
              __args_03._0_8_ =
                   outputFileMapPath.super_SmallVector<char,_64U>.
                   super_SmallVectorStorage<char,_64U>.InlineElts._56_8_;
              __args_03.utime = local_258;
              __args_03.stime = uStack_250;
              __args_03.maxrss = local_248;
              std::function<void_(llbuild::basic::ProcessResult)>::operator()(pfVar6,__args_03);
            }
          }
        }
        else {
          pBVar5 = llbuild::buildsystem::BuildSystem::getDelegate((BuildSystem *)context_local);
          local_1b8 = "";
          local_1b0 = strlen("");
          local_1c8 = 0;
          local_1c0 = 0;
          llvm::Twine::Twine(&local_1e0,"no configured \'temps-path\'");
          (*pBVar5->_vptr_BuildSystemDelegate[3])(pBVar5,local_1b8,local_1b0,&local_1c8,&local_1e0);
          bVar1 = llvm::Optional<std::function<void_(llbuild::basic::ProcessResult)>_>::hasValue
                            (completionFn);
          if (bVar1) {
            pfVar6 = llvm::Optional<std::function<void_(llbuild::basic::ProcessResult)>_>::getValue
                               (completionFn);
            llbuild::basic::ProcessResult::ProcessResult(&local_208,Failed,-1,-1,0,0,0);
            __args_02.pid = local_208.pid;
            __args_02._12_4_ = local_208._12_4_;
            __args_02.status = local_208.status;
            __args_02.exitCode = local_208.exitCode;
            __args_02.utime = local_208.utime;
            __args_02.stime = local_208.stime;
            __args_02.maxrss = local_208.maxrss;
            std::function<void_(llbuild::basic::ProcessResult)>::operator()(pfVar6,__args_02);
          }
        }
      }
      else {
        pBVar5 = llbuild::buildsystem::BuildSystem::getDelegate((BuildSystem *)context_local);
        local_158 = "";
        local_150 = strlen("");
        local_168 = 0;
        local_160 = 0;
        llvm::Twine::Twine(&local_180,"no configured \'module-name\'");
        (*pBVar5->_vptr_BuildSystemDelegate[3])(pBVar5,local_158,local_150,&local_168,&local_180);
        bVar1 = llvm::Optional<std::function<void_(llbuild::basic::ProcessResult)>_>::hasValue
                          (completionFn);
        if (bVar1) {
          pfVar6 = llvm::Optional<std::function<void_(llbuild::basic::ProcessResult)>_>::getValue
                             (completionFn);
          llbuild::basic::ProcessResult::ProcessResult(&local_1a8,Failed,-1,-1,0,0,0);
          __args_01.pid = local_1a8.pid;
          __args_01._12_4_ = local_1a8._12_4_;
          __args_01.status = local_1a8.status;
          __args_01.exitCode = local_1a8.exitCode;
          __args_01.utime = local_1a8.utime;
          __args_01.stime = local_1a8.stime;
          __args_01.maxrss = local_1a8.maxrss;
          std::function<void_(llbuild::basic::ProcessResult)>::operator()(pfVar6,__args_01);
        }
      }
    }
  }
  return;
}

Assistant:

virtual void executeExternalCommand(
      BuildSystem& system,
      TaskInterface ti,
      QueueJobContext* context,
      llvm::Optional<ProcessCompletionFn> completionFn) override {
    // FIXME: Need to add support for required parameters.
    if (sourcesList.empty()) {
      system.getDelegate().error("", {}, "no configured 'sources'");
      if (completionFn.hasValue())
        completionFn.getValue()(ProcessStatus::Failed);
      return;
    }
    if (objectsList.empty()) {
      system.getDelegate().error("", {}, "no configured 'objects'");
      if (completionFn.hasValue())
        completionFn.getValue()(ProcessStatus::Failed);
      return;
    }
    if (moduleName.empty()) {
      system.getDelegate().error("", {}, "no configured 'module-name'");
      if (completionFn.hasValue())
        completionFn.getValue()(ProcessStatus::Failed);
      return;
    }
    if (tempsPath.empty()) {
      system.getDelegate().error("", {}, "no configured 'temps-path'");
      if (completionFn.hasValue())
        completionFn.getValue()(ProcessStatus::Failed);
      return;
    }

    if (sourcesList.size() != objectsList.size()) {
      system.getDelegate().error(
          "", {}, "'sources' and 'objects' are not the same size");
      if (completionFn.hasValue())
        completionFn.getValue()(ProcessStatus::Failed);
      return;
    }

    // Ensure the temporary directory exists.
    //
    // We ignore failures here, and just let things that depend on this fail.
    //
    // FIXME: This should really be done using an additional implicit input, so
    // it only happens once per build.
    (void) system.getFileSystem().createDirectories(tempsPath);
 
    SmallString<64> outputFileMapPath;
    getOutputFileMapPath(outputFileMapPath);
    
    // Form the complete command.
    std::vector<StringRef> commandLine;
    constructCommandLineArgs(outputFileMapPath, commandLine);

    // Write the output file map.
    std::vector<std::string> depsFiles;
    if (!writeOutputFileMap(ti, outputFileMapPath, depsFiles)) {
      if (completionFn.hasValue())
        completionFn.getValue()(ProcessStatus::Failed);
      return;
    }

    // Execute the command.
    auto result = ti.spawn(context, commandLine);

    if (result != ProcessStatus::Succeeded) {
      // If the command failed, there is no need to gather dependencies.
      if (completionFn.hasValue())
        completionFn.getValue()(result);
      return;
    }

    // Load all of the discovered dependencies.
    ti.spawn({ this, [this, ti, completionFn, result, depsFiles](QueueJobContext* context) mutable {
      for (const auto& depsPath: depsFiles) {
        if (!processDiscoveredDependencies(ti, depsPath)) {
          if (completionFn.hasValue())
            completionFn.getValue()(ProcessStatus::Failed);
          return;
        }
      }
      if (completionFn.hasValue())
        completionFn.getValue()(result);
    }}, basic::QueueJobPriority::High);
  }